

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::u32string,char32_t[1]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *lhs,
          char *op,char32_t (*rhs) [1])

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  char32_t (*local_28) [1];
  char32_t (*rhs_local) [1];
  char *op_local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *lhs_local;
  
  local_28 = (char32_t (*) [1])op;
  rhs_local = (char32_t (*) [1])lhs;
  op_local = (char *)this;
  lhs_local = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
              __return_storage_ptr__;
  toString<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_true>
            (&local_58,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  operator+(&local_40,&local_58,&local_70);
  toString<char32_t[1],_true>(&local_98,local_28);
  operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }